

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall
mocker::SemanticChecker::collectSymbols::Collect::operator()(Collect *this,VarDecl *decl)

{
  ScopeID *pSVar1;
  SemanticContext *pSVar2;
  bool bVar3;
  DuplicatedSymbols *this_00;
  mapped_type *pos;
  __shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> a_Stack_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  shared_ptr<mocker::ast::ASTNode> local_78;
  string varName;
  shared_ptr<mocker::ast::Declaration> local_48;
  
  pSVar1 = this->scope;
  SymTbl::global(&this->ctx->syms);
  bVar3 = ScopeID::operator==(pSVar1,(ScopeID *)&varName);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&varName);
  if (!bVar3) {
    std::__cxx11::string::string
              ((string *)&varName,
               (string *)
               &((((decl->decl).
                   super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
    pSVar1 = this->scope;
    pSVar2 = this->ctx;
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::ASTNode,void>
              (a_Stack_88,
               (__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &(decl->super_Declaration).super_ASTNode.
                super_enable_shared_from_this<mocker::ast::ASTNode>);
    std::static_pointer_cast<mocker::ast::VarDecl,mocker::ast::ASTNode>(&local_78);
    local_48.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_78.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    local_78.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar3 = SymTbl::addSymbol(&pSVar2->syms,pSVar1,&varName,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    if (!bVar3) {
      this_00 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
      local_78.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)decl;
      pos = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)this->pos,(key_type *)&local_78);
      DuplicatedSymbols::DuplicatedSymbols(this_00,pos,&varName);
      __cxa_throw(this_00,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
    }
    std::__cxx11::string::~string((string *)&varName);
  }
  return;
}

Assistant:

void operator()(ast::VarDecl &decl) const override {
#ifdef DISABLE_FORWARD_REFERENCE_FOR_GLOBAL_VAR
      if (scope == ctx.syms.global())
        return;
#endif
      std::string varName = decl.decl->identifier->val;
      auto res = ctx.syms.addSymbol(
          scope, varName,
          std::static_pointer_cast<ast::VarDecl>(decl.shared_from_this()));
      if (!res)
        throw DuplicatedSymbols(pos.at(decl.getID()), varName);
    }